

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strscan.c
# Opt level: O3

StrScanFmt lj_strscan_scan(uint8_t *p,MSize len,TValue *o,uint32_t opt)

{
  double dVar1;
  StrScanFmt SVar2;
  ulong uVar3;
  uint64_t uVar4;
  uint uVar5;
  uint uVar6;
  byte *pbVar7;
  uint dig;
  byte *pbVar8;
  int iVar9;
  byte bVar10;
  ulong uVar11;
  long lVar12;
  byte bVar13;
  byte bVar14;
  int iVar15;
  byte *pbVar16;
  long lVar17;
  byte *pbVar18;
  uint uVar19;
  uint uVar20;
  bool bVar21;
  bool bVar22;
  lua_Number lVar23;
  uint local_38;
  
  pbVar8 = p + len;
  uVar11 = (ulong)*p;
  bVar21 = false;
  pbVar18 = p;
  if ((""[uVar11 + 1] & 8) == 0) {
    do {
      p = pbVar18;
      bVar10 = *p;
      uVar11 = (ulong)bVar10;
      pbVar18 = p + 1;
    } while ((""[uVar11 + 1] & 2) != 0);
    if ((bVar10 == 0x2b) || (bVar10 == 0x2d)) {
      local_38 = (uint)(bVar10 == 0x2d);
      uVar11 = (ulong)*pbVar18;
      p = pbVar18;
    }
    else {
      local_38 = 0;
    }
    if (0x40 < (byte)uVar11) {
      uVar4 = 0xfff8000000000000;
      bVar10 = (byte)uVar11 & 0xdf;
      pbVar18 = p;
      if (bVar10 == 0x4e) {
        if ((p[1] & 0xdf) == 0x41) {
          pbVar18 = p + (ulong)((p[2] & 0xdf) == 0x4e) * 3;
        }
      }
      else if (((bVar10 == 0x49) && ((p[1] & 0xdf) == 0x4e)) && ((p[2] & 0xdf) == 0x46)) {
        uVar4 = 0xfff0000000000000;
        if (local_38 == 0) {
          uVar4 = 0x7ff0000000000000;
        }
        pbVar16 = p + 3;
        pbVar18 = pbVar16;
        if ((((p[3] & 0xdf) == 0x49) && ((p[4] & 0xdf) == 0x4e)) &&
           (((p[5] & 0xdf) == 0x49 &&
            (((p[6] & 0xdf) == 0x54 && (pbVar18 = p + 8, (p[7] & 0xdf) != 0x59)))))) {
          pbVar18 = pbVar16;
        }
      }
      pbVar18 = pbVar18 + -1;
      do {
        pbVar16 = pbVar18 + 1;
        pbVar18 = pbVar18 + 1;
      } while ((""[(ulong)*pbVar16 + 1] & 2) != 0);
      if (pbVar8 <= pbVar18 && *pbVar16 == 0) {
        o->u64 = uVar4;
        return STRSCAN_NUM;
      }
      return STRSCAN_ERROR;
    }
  }
  else {
    local_38 = 0;
  }
  bVar10 = (byte)uVar11;
  uVar19 = 10;
  if (bVar10 == 0x30) {
    uVar19 = 0;
  }
  if ((opt & 0x10) == 0) {
    uVar19 = 10;
  }
  bVar13 = 8;
  bVar14 = 8;
  if (bVar10 < 0x31) {
    bVar14 = bVar13;
    if (bVar10 == 0x30) {
      if ((p[1] | 0x20) == 0x62) {
        p = p + 2;
        uVar19 = 2;
      }
      else if ((p[1] | 0x20) == 0x78) {
        p = p + 2;
        uVar19 = 0x10;
        bVar14 = 0x10;
      }
    }
    pbVar18 = (byte *)0x0;
    do {
      bVar10 = *p;
      uVar11 = (ulong)bVar10;
      if (bVar10 == 0x30) {
        bVar21 = true;
      }
      else {
        if (bVar10 != 0x2e) goto LAB_00116754;
        bVar22 = pbVar18 != (byte *)0x0;
        pbVar18 = p;
        if (bVar22) {
          return STRSCAN_ERROR;
        }
      }
      p = p + 1;
    } while( true );
  }
  pbVar18 = (byte *)0x0;
LAB_00116754:
  lVar12 = 0;
  dig = 0;
  uVar20 = 0;
  uVar3 = uVar11;
  do {
    bVar10 = (byte)uVar3;
    if ((bVar14 & ""[uVar3 + 1]) == 0) {
      if (bVar10 != 0x2e) {
        if (!bVar21 && dig == 0) {
          return STRSCAN_ERROR;
        }
        if (pbVar18 == (byte *)0x0) {
          SVar2 = STRSCAN_INT;
          iVar9 = 0;
          goto LAB_00116819;
        }
        if (uVar19 == 2) {
          return STRSCAN_ERROR;
        }
        SVar2 = STRSCAN_NUM;
        if (dig == 0) {
          dig = 0;
          iVar9 = 0;
          goto LAB_00116819;
        }
        pbVar16 = pbVar18 + ((ulong)(uint)-(int)p - lVar12) + 1;
        iVar15 = (int)pbVar16;
        if (-1 < iVar15) goto LAB_001167f9;
        pbVar7 = p + lVar12;
        iVar9 = ((int)pbVar18 + -(int)p) - (int)lVar12;
        break;
      }
      if (pbVar18 != (byte *)0x0) {
        return STRSCAN_ERROR;
      }
      pbVar18 = p + lVar12;
    }
    else {
      uVar20 = (uint)(bVar10 & 0xf) + uVar20 * 10;
      dig = dig + 1;
    }
    uVar3 = (ulong)p[lVar12 + 1];
    lVar12 = lVar12 + 1;
  } while( true );
  while( true ) {
    pbVar16 = (byte *)(ulong)(iVar15 + 1);
    dig = dig - 1;
    iVar9 = iVar9 + 1;
    if (-2 < iVar9) break;
    pbVar7 = pbVar7 + -1;
    iVar15 = (int)pbVar16;
    if (*pbVar7 != 0x30) goto LAB_001167f9;
  }
  iVar15 = 0;
LAB_001167f9:
  iVar9 = iVar15 * 4;
  if (uVar19 != 0x10) {
    iVar9 = iVar15;
  }
LAB_00116819:
  pbVar18 = p + lVar12;
  if (9 < uVar19) {
    bVar14 = 0x65;
    if (uVar19 == 0x10) {
      bVar14 = 0x70;
    }
    if (bVar14 == (bVar10 | 0x20)) {
      bVar10 = p[lVar12 + 1];
      if ((bVar10 == 0x2d) || (bVar10 == 0x2b)) {
        bVar21 = bVar10 != 0x2d;
        bVar10 = p[lVar12 + 2];
        lVar17 = 2;
      }
      else {
        lVar17 = 1;
        bVar21 = true;
      }
      if ((""[(ulong)bVar10 + 1] & 8) == 0) {
        return STRSCAN_ERROR;
      }
      pbVar18 = p + lVar12 + lVar17 + 1;
      uVar3 = (ulong)*pbVar18;
      uVar6 = (uint)(bVar10 & 0xf);
      if ((""[uVar3 + 1] & 8) == 0) {
        uVar5 = (uint)(bVar10 & 0xf);
      }
      else {
        do {
          uVar5 = (uint)((byte)uVar3 & 0xf) + uVar6 * 10;
          if (0xffff < uVar6) {
            uVar5 = uVar6;
          }
          uVar3 = (ulong)pbVar18[1];
          pbVar18 = pbVar18 + 1;
          uVar6 = uVar5;
        } while ((""[uVar3 + 1] & 8) != 0);
      }
      uVar6 = -uVar5;
      if (bVar21) {
        uVar6 = uVar5;
      }
      iVar9 = iVar9 + uVar6;
      SVar2 = STRSCAN_NUM;
    }
  }
  if ((byte)uVar3 != 0) {
    bVar10 = (byte)uVar3 | 0x20;
    if (bVar10 == 0x69) {
      if ((opt & 4) == 0) {
        return STRSCAN_ERROR;
      }
      pbVar18 = pbVar18 + 1;
      SVar2 = STRSCAN_IMAG;
    }
    else if (SVar2 == STRSCAN_INT) {
      bVar21 = bVar10 == 0x75;
      SVar2 = bVar21 + STRSCAN_INT;
      pbVar16 = pbVar18 + bVar21;
      if ((pbVar18[bVar21] & 0xdf) == 0x4c) {
        if ((pbVar16[1] & 0xdf) == 0x4c) {
          pbVar16 = pbVar16 + 2;
        }
        else {
          if ((opt & 0x10) == 0) {
            return STRSCAN_ERROR;
          }
          pbVar16 = pbVar16 + 1;
        }
        SVar2 = bVar21 + STRSCAN_I64;
      }
      if (((*pbVar16 & 0xdf) == 0x55) && ((SVar2 == STRSCAN_I64 || (SVar2 == STRSCAN_INT)))) {
        pbVar16 = pbVar16 + 1;
        SVar2 = SVar2 + STRSCAN_NUM;
      }
      if (((opt & 0x10) == 0) && (SVar2 == STRSCAN_U32)) {
        return STRSCAN_ERROR;
      }
      pbVar18 = pbVar16;
      if (((opt & 8) == 0) && (STRSCAN_U32 < SVar2)) {
        return STRSCAN_ERROR;
      }
    }
    pbVar18 = pbVar18 + -1;
    do {
      pbVar16 = pbVar18 + 1;
      pbVar18 = pbVar18 + 1;
    } while ((""[(ulong)*pbVar16 + 1] & 2) != 0);
    if (*pbVar16 != 0) {
      return STRSCAN_ERROR;
    }
  }
  if (pbVar18 < pbVar8) {
    return STRSCAN_ERROR;
  }
  if ((SVar2 == STRSCAN_INT) && (uVar19 == 10)) {
    if ((dig < 10) || (((dig == 10 && ((byte)uVar11 < 0x33)) && (uVar20 < local_38 + 0x80000000))))
    {
      if ((opt & 2) != 0) {
        lVar23 = (lua_Number)uVar20;
        if (local_38 != 0) {
          lVar23 = (lua_Number)((ulong)lVar23 | (ulong)DAT_001616c0);
        }
        o->n = lVar23;
        return STRSCAN_NUM;
      }
      uVar19 = -uVar20;
      if (local_38 == 0) {
        uVar19 = uVar20;
      }
      goto LAB_00116b39;
    }
LAB_00116a58:
    SVar2 = strscan_dec(p,o,SVar2,opt,iVar9,local_38,dig);
  }
  else {
    if ((uVar19 == 0) && (1 < SVar2 - STRSCAN_NUM)) {
      SVar2 = strscan_oct(p,o,SVar2,local_38,dig);
      return SVar2;
    }
    if (uVar19 == 2) {
      SVar2 = strscan_bin(p,o,SVar2,opt,iVar9,local_38,dig);
    }
    else {
      if (uVar19 != 0x10) goto LAB_00116a58;
      SVar2 = strscan_hex(p,o,SVar2,opt,iVar9,local_38,dig);
    }
  }
  if ((opt & 1) == 0) {
    return SVar2;
  }
  if (SVar2 != STRSCAN_NUM) {
    return SVar2;
  }
  dVar1 = o->n;
  if (dVar1 != (double)(int)dVar1) {
    return STRSCAN_NUM;
  }
  if (NAN(dVar1) || NAN((double)(int)dVar1)) {
    return STRSCAN_NUM;
  }
  uVar19 = (int)dVar1;
LAB_00116b39:
  (o->field_4).i = uVar19;
  return STRSCAN_INT;
}

Assistant:

StrScanFmt lj_strscan_scan(const uint8_t *p, MSize len, TValue *o,
			   uint32_t opt)
{
  int32_t neg = 0;
  const uint8_t *pe = p + len;

  /* Remove leading space, parse sign and non-numbers. */
  if (LJ_UNLIKELY(!lj_char_isdigit(*p))) {
    while (lj_char_isspace(*p)) p++;
    if (*p == '+' || *p == '-') neg = (*p++ == '-');
    if (LJ_UNLIKELY(*p >= 'A')) {  /* Parse "inf", "infinity" or "nan". */
      TValue tmp;
      setnanV(&tmp);
      if (casecmp(p[0],'i') && casecmp(p[1],'n') && casecmp(p[2],'f')) {
	if (neg) setminfV(&tmp); else setpinfV(&tmp);
	p += 3;
	if (casecmp(p[0],'i') && casecmp(p[1],'n') && casecmp(p[2],'i') &&
	    casecmp(p[3],'t') && casecmp(p[4],'y')) p += 5;
      } else if (casecmp(p[0],'n') && casecmp(p[1],'a') && casecmp(p[2],'n')) {
	p += 3;
      }
      while (lj_char_isspace(*p)) p++;
      if (*p || p < pe) return STRSCAN_ERROR;
      o->u64 = tmp.u64;
      return STRSCAN_NUM;
    }
  }

  /* Parse regular number. */
  {
    StrScanFmt fmt = STRSCAN_INT;
    int cmask = LJ_CHAR_DIGIT;
    int base = (opt & STRSCAN_OPT_C) && *p == '0' ? 0 : 10;
    const uint8_t *sp, *dp = NULL;
    uint32_t dig = 0, hasdig = 0, x = 0;
    int32_t ex = 0;

    /* Determine base and skip leading zeros. */
    if (LJ_UNLIKELY(*p <= '0')) {
      if (*p == '0') {
	if (casecmp(p[1], 'x'))
	  base = 16, cmask = LJ_CHAR_XDIGIT, p += 2;
	else if (casecmp(p[1], 'b'))
	  base = 2, cmask = LJ_CHAR_DIGIT, p += 2;
      }
      for ( ; ; p++) {
	if (*p == '0') {
	  hasdig = 1;
	} else if (*p == '.') {
	  if (dp) return STRSCAN_ERROR;
	  dp = p;
	} else {
	  break;
	}
      }
    }

    /* Preliminary digit and decimal point scan. */
    for (sp = p; ; p++) {
      if (LJ_LIKELY(lj_char_isa(*p, cmask))) {
	x = x * 10 + (*p & 15);  /* For fast path below. */
	dig++;
      } else if (*p == '.') {
	if (dp) return STRSCAN_ERROR;
	dp = p;
      } else {
	break;
      }
    }
    if (!(hasdig | dig)) return STRSCAN_ERROR;

    /* Handle decimal point. */
    if (dp) {
      if (base == 2) return STRSCAN_ERROR;
      fmt = STRSCAN_NUM;
      if (dig) {
	ex = (int32_t)(dp-(p-1)); dp = p-1;
	while (ex < 0 && *dp-- == '0') ex++, dig--;  /* Skip trailing zeros. */
	if (base == 16) ex *= 4;
      }
    }

    /* Parse exponent. */
    if (base >= 10 && casecmp(*p, (uint32_t)(base == 16 ? 'p' : 'e'))) {
      uint32_t xx;
      int negx = 0;
      fmt = STRSCAN_NUM; p++;
      if (*p == '+' || *p == '-') negx = (*p++ == '-');
      if (!lj_char_isdigit(*p)) return STRSCAN_ERROR;
      xx = (*p++ & 15);
      while (lj_char_isdigit(*p)) {
	if (xx < 65536) xx = xx * 10 + (*p & 15);
	p++;
      }
      ex += negx ? -(int32_t)xx : (int32_t)xx;
    }

    /* Parse suffix. */
    if (*p) {
      /* I (IMAG), U (U32), LL (I64), ULL/LLU (U64), L (long), UL/LU (ulong). */
      /* NYI: f (float). Not needed until cp_number() handles non-integers. */
      if (casecmp(*p, 'i')) {
	if (!(opt & STRSCAN_OPT_IMAG)) return STRSCAN_ERROR;
	p++; fmt = STRSCAN_IMAG;
      } else if (fmt == STRSCAN_INT) {
	if (casecmp(*p, 'u')) p++, fmt = STRSCAN_U32;
	if (casecmp(*p, 'l')) {
	  p++;
	  if (casecmp(*p, 'l')) p++, fmt += STRSCAN_I64 - STRSCAN_INT;
	  else if (!(opt & STRSCAN_OPT_C)) return STRSCAN_ERROR;
	  else if (sizeof(long) == 8) fmt += STRSCAN_I64 - STRSCAN_INT;
	}
	if (casecmp(*p, 'u') && (fmt == STRSCAN_INT || fmt == STRSCAN_I64))
	  p++, fmt += STRSCAN_U32 - STRSCAN_INT;
	if ((fmt == STRSCAN_U32 && !(opt & STRSCAN_OPT_C)) ||
	    (fmt >= STRSCAN_I64 && !(opt & STRSCAN_OPT_LL)))
	  return STRSCAN_ERROR;
      }
      while (lj_char_isspace(*p)) p++;
      if (*p) return STRSCAN_ERROR;
    }
    if (p < pe) return STRSCAN_ERROR;

    /* Fast path for decimal 32 bit integers. */
    if (fmt == STRSCAN_INT && base == 10 &&
	(dig < 10 || (dig == 10 && *sp <= '2' && x < 0x80000000u+neg))) {
      if ((opt & STRSCAN_OPT_TONUM)) {
	o->n = neg ? -(double)x : (double)x;
	return STRSCAN_NUM;
      } else {
	o->i = neg ? -(int32_t)x : (int32_t)x;
	return STRSCAN_INT;
      }
    }

    /* Dispatch to base-specific parser. */
    if (base == 0 && !(fmt == STRSCAN_NUM || fmt == STRSCAN_IMAG))
      return strscan_oct(sp, o, fmt, neg, dig);
    if (base == 16)
      fmt = strscan_hex(sp, o, fmt, opt, ex, neg, dig);
    else if (base == 2)
      fmt = strscan_bin(sp, o, fmt, opt, ex, neg, dig);
    else
      fmt = strscan_dec(sp, o, fmt, opt, ex, neg, dig);

    /* Try to convert number to integer, if requested. */
    if (fmt == STRSCAN_NUM && (opt & STRSCAN_OPT_TOINT)) {
      double n = o->n;
      int32_t i = lj_num2int(n);
      if (n == (lua_Number)i) { o->i = i; return STRSCAN_INT; }
    }
    return fmt;
  }
}